

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O2

void dxil_spv::build_ssbo_store
               (Builder *builder,Id value_type,Id ssbo_id,uint32_t member,Id value_id)

{
  _Head_base<0UL,_spv::Instruction_*,_false> this;
  Id id;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  undefined4 local_54;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id ptr_id;
  
  ptr_id = spv::Builder::makePointer(builder,StorageClassStorageBuffer,value_type);
  local_60._M_head_impl._0_4_ = builder->uniqueId + 1;
  builder->uniqueId = (Id)local_60._M_head_impl;
  local_54 = 0x41;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_40,(uint *)&local_60,&ptr_id);
  spv::Instruction::addIdOperand(local_40._M_head_impl,ssbo_id);
  this._M_head_impl = local_40._M_head_impl;
  id = spv::Builder::makeUintConstant(builder,member,false);
  spv::Instruction::addIdOperand(this._M_head_impl,id);
  local_54 = 0x3e;
  std::make_unique<spv::Instruction,spv::Op>((Op *)&local_60);
  spv::Instruction::addIdOperand(local_60._M_head_impl,(local_40._M_head_impl)->resultId);
  spv::Instruction::addIdOperand(local_60._M_head_impl,value_id);
  local_48._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (builder->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  local_48._M_head_impl = (Instruction *)0x0;
  local_50._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (builder->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  local_50._M_head_impl = (Instruction *)0x0;
  if (local_60._M_head_impl != (Instruction *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Instruction[1])();
  }
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  return;
}

Assistant:

static void build_ssbo_store(spv::Builder &builder, spv::Id value_type, spv::Id ssbo_id, uint32_t member, spv::Id value_id)
{
	spv::Id ptr_id = builder.makePointer(spv::StorageClassStorageBuffer, value_type);
	auto chain = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_id, spv::OpAccessChain);
	chain->addIdOperand(ssbo_id);
	chain->addIdOperand(builder.makeUintConstant(member));

	auto store = std::make_unique<spv::Instruction>(spv::OpStore);
	store->addIdOperand(chain->getResultId());
	store->addIdOperand(value_id);

	builder.getBuildPoint()->addInstruction(std::move(chain));
	builder.getBuildPoint()->addInstruction(std::move(store));
}